

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::AlignmentTests_NoSource_Test::TestBody(AlignmentTests_NoSource_Test *this)

{
  bool bVar1;
  char *in_RCX;
  string_view sv;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  _Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    sv._M_str = in_RCX;
    sv._M_len = (size_t)"-3";
    readAlignment((Alignment *)&local_20,(thrax *)0x2,sv);
    std::_Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~_Vector_base
              (&local_20);
  }
  testing::Message::Message((Message *)&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
             ,0x49,
             "Expected: readAlignment(\"-3\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return;
}

Assistant:

TEST(AlignmentTests, NoSource) {
  EXPECT_THROW(readAlignment("-3"), std::invalid_argument);
}